

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O3

void Npn_TruthPermute_rec(char *pStr,int mid,int end)

{
  char cVar1;
  size_t sVar2;
  char *__dest;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  
  if (pStr == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(pStr);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,pStr);
  }
  if (mid == end) {
    uVar3 = (ulong)(uint)Npn_TruthPermute_rec::count;
    Npn_TruthPermute_rec::count = Npn_TruthPermute_rec::count + 1;
    printf("%03d: %s\n",uVar3,__dest);
    return;
  }
  if (end < mid) {
    if (__dest == (char *)0x0) {
      return;
    }
  }
  else {
    pcVar5 = __dest + mid;
    lVar4 = 0;
    do {
      cVar1 = *pcVar5;
      *pcVar5 = pcVar5[lVar4];
      pcVar5[lVar4] = cVar1;
      Npn_TruthPermute_rec(__dest,mid + 1,end);
      cVar1 = *pcVar5;
      *pcVar5 = pcVar5[lVar4];
      pcVar5[lVar4] = cVar1;
      lVar4 = lVar4 + 1;
    } while ((end - mid) + 1 != (int)lVar4);
  }
  free(__dest);
  return;
}

Assistant:

void Npn_TruthPermute_rec( char * pStr, int mid, int end )
{
    static int count = 0;
    char * pTemp = Abc_UtilStrsav(pStr);
    char e;
    int i;
    if ( mid == end ) 
    {
        printf( "%03d: %s\n", count++, pTemp );
        return ;
    }
    for ( i = mid; i <= end; i++ )
    {
        e = pTemp[mid];
        pTemp[mid] = pTemp[i];
        pTemp[i] = e;

        Npn_TruthPermute_rec( pTemp, mid + 1, end );

        e = pTemp[mid];
        pTemp[mid] = pTemp[i];
        pTemp[i] = e;
    }
    ABC_FREE( pTemp );
}